

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall
QTableViewPrivate::heightHintForIndex
          (QTableViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option)

{
  Representation *pRVar1;
  QTableView *this_00;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  QEditorInfo *pQVar5;
  int extraout_var;
  QSize QVar6;
  QSize QVar7;
  Span *span;
  long *plVar8;
  int extraout_var_00;
  int iVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QWidget *editor;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar5 = QAbstractItemViewPrivate::editorForIndex(&this->super_QAbstractItemViewPrivate,index);
  pDVar2 = (pQVar5->widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    local_40 = (QWidget *)0x0;
  }
  else {
    local_40 = (QWidget *)(pQVar5->widget).wp.value;
    if ((local_40 != (QWidget *)0x0) &&
       (bVar3 = QHash<QWidget_*,_QHashDummyValue>::contains
                          (&(this->super_QAbstractItemViewPrivate).persistent.q_hash,&local_40),
       bVar3)) {
      (**(code **)(*(long *)local_40 + 0x70))();
      if (hint < extraout_var) {
        hint = extraout_var;
      }
      QVar6 = QWidget::minimumSize(local_40);
      QVar7 = QWidget::maximumSize(local_40);
      if (QVar7.ht.m_i.m_i < hint) {
        hint = QVar7.ht.m_i.m_i;
      }
      if (hint <= QVar6.ht.m_i.m_i) {
        hint = QVar6.ht.m_i.m_i;
      }
    }
  }
  if ((this->super_QAbstractItemViewPrivate).wrapItemText == true) {
    iVar4 = QTableView::rowViewportPosition(this_00,index->r);
    (option->super_QStyleOption).rect.y1.m_i = iVar4;
    iVar4 = QTableView::rowHeight(this_00,index->r);
    (option->super_QStyleOption).rect.y2.m_i =
         iVar4 + (option->super_QStyleOption).rect.y1.m_i + (uint)(iVar4 == 0) + -1;
    iVar4 = QTableView::columnViewportPosition(this_00,index->c);
    (option->super_QStyleOption).rect.x1.m_i = iVar4;
    iVar4 = QTableView::columnWidth(this_00,index->c);
    (option->super_QStyleOption).rect.x2.m_i = iVar4 + (option->super_QStyleOption).rect.x1.m_i + -1
    ;
    if (((((QSpanCollection *)
           (this->spans).spans.
           super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
           _M_impl._M_node.super__List_node_base._M_next != &this->spans) &&
         (span = QSpanCollection::spanAt(&this->spans,index->c,index->r), span != (Span *)0x0)) &&
        (span->m_left == index->c)) && (span->m_top == index->r)) {
      iVar9 = ((option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i)
              + 1;
      QVar10 = visualSpanRect(this,span);
      iVar4 = (QVar10.x2.m_i.m_i - QVar10.x1.m_i) + 1;
      if (iVar4 < iVar9) {
        iVar4 = iVar9;
      }
      (option->super_QStyleOption).rect.x2.m_i =
           (option->super_QStyleOption).rect.x1.m_i + iVar4 + -1;
    }
    if (this->showGrid == true) {
      pRVar1 = &(option->super_QStyleOption).rect.x2;
      pRVar1->m_i = pRVar1->m_i + -1;
    }
  }
  plVar8 = (long *)(**(code **)(*(long *)&(this_00->super_QAbstractItemView).
                                          super_QAbstractScrollArea.super_QFrame.super_QWidget +
                               0x208))(this_00,index);
  (**(code **)(*plVar8 + 0x68))(plVar8,option,index);
  iVar4 = extraout_var_00;
  if (extraout_var_00 < hint) {
    iVar4 = hint;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QTableViewPrivate::heightHintForIndex(const QModelIndex &index, int hint, QStyleOptionViewItem &option) const
{
    Q_Q(const QTableView);
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().height());
        int min = editor->minimumSize().height();
        int max = editor->maximumSize().height();
        hint = qBound(min, hint, max);
    }

    if (wrapItemText) {// for wrapping boundaries
        option.rect.setY(q->rowViewportPosition(index.row()));
        int height = q->rowHeight(index.row());
        // if the option.height == 0 then q->itemDelegateForIndex(index)->sizeHint(option, index) will be wrong.
        // The option.height == 0 is used to conclude that the text is not wrapped, and hence it will
        // (exactly like widthHintForIndex) return a QSize with a long width (that we don't use) -
        // and the height of the text if it was/is on one line.
        // What we want is a height hint for the current width (and we know that this section is not hidden)
        // Therefore we catch this special situation with:
        if (height == 0)
            height = 1;
        option.rect.setHeight(height);
        option.rect.setX(q->columnViewportPosition(index.column()));
        option.rect.setWidth(q->columnWidth(index.column()));
        if (hasSpans()) {
            auto span = spans.spanAt(index.column(), index.row());
            if (span && span->m_left == index.column() && span->m_top == index.row())
                option.rect.setWidth(std::max(option.rect.width(), visualSpanRect(*span).width()));
        }
        // 1px less space when grid is shown (see drawCell)
        if (showGrid)
            option.rect.setWidth(option.rect.width() - 1);
    }
    hint = qMax(hint, q->itemDelegateForIndex(index)->sizeHint(option, index).height());
    return hint;
}